

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_image_uniforms_limit
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  ostream *poVar2;
  ProgramSources *sources;
  int iVar3;
  ShaderProgram program;
  ostringstream shaderBody;
  ostringstream shaderDecl;
  string local_548;
  string local_528;
  string local_508;
  undefined1 local_4e8 [40];
  ProgramSources local_4c0;
  ShaderProgram local_3f0;
  ostream local_320;
  ostream local_1a8;
  
  iVar1 = getResourceLimit(ctx,0x91bd);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  poVar2 = std::operator<<(&local_1a8,"layout(rgba8, binding = 0) ");
  poVar2 = std::operator<<(poVar2,"uniform readonly highp image2D u_image[");
  iVar1 = iVar1 + 1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"];\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(binding = 0) buffer Output {\n");
  poVar2 = std::operator<<(poVar2,"    float values[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"];\n");
  std::operator<<(poVar2,"} sb_out;\n");
  iVar3 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != iVar3; iVar3 = iVar3 + 1) {
    poVar2 = std::operator<<(&local_320,"    sb_out.values[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
    poVar2 = std::operator<<(poVar2,"]");
    poVar2 = std::operator<<(poVar2,"  = imageLoad(u_image[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
    std::operator<<(poVar2,"], ivec2(gl_GlobalInvocationID.xy)).x;\n");
  }
  renderCtx = ctx->m_renderCtx;
  memset(&local_4c0,0,0xac);
  local_4c0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_4c0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_4c0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_4c0._193_8_ = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateComputeShader(&local_508,ctx,&local_528,&local_548);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_4e8,&local_508);
  sources = glu::ProgramSources::operator<<(&local_4c0,(ShaderSource *)local_4e8);
  glu::ShaderProgram::ShaderProgram(&local_3f0,renderCtx,sources);
  std::__cxx11::string::~string((string *)(local_4e8 + 8));
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_528);
  glu::ProgramSources::~ProgramSources(&local_4c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,
             "Link error is generated if compute shader exceeds GL_MAX_COMPUTE_IMAGE_UNIFORMS.",
             (allocator<char> *)local_4e8);
  NegativeTestContext::beginSection(ctx,(string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  verifyLinkError(ctx,&local_3f0);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&local_3f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void exceed_image_uniforms_limit (NegativeTestContext& ctx)
{
	const int			limit = getResourceLimit(ctx, GL_MAX_COMPUTE_IMAGE_UNIFORMS);
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "layout(rgba8, binding = 0) "
				<< "uniform readonly highp image2D u_image[" << limit + 1 << "];\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    float values[" << limit + 1 << "];\n"
				<< "} sb_out;\n";

	for (int i = 0; i < limit + 1; ++i)
		shaderBody	<< "    sb_out.values[" << i << "]" << "  = imageLoad(u_image[" << i << "], ivec2(gl_GlobalInvocationID.xy)).x;\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if compute shader exceeds GL_MAX_COMPUTE_IMAGE_UNIFORMS.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}